

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clCommandCopyBufferKHR
                 (cl_command_buffer_khr command_buffer,cl_command_queue command_queue,
                 cl_command_properties_khr *properties,cl_mem src_buffer,cl_mem dst_buffer,
                 size_t src_offset,size_t dst_offset,size_t size,
                 cl_uint num_sync_points_in_wait_list,cl_sync_point_khr *sync_point_wait_list,
                 cl_sync_point_khr *sync_point,cl_mutable_command_khr *mutable_handle)

{
  time_point start;
  uint64_t enqueueCounter_00;
  cl_int cVar1;
  CLIntercept *pCVar2;
  CLdispatchX *pCVar3;
  SConfig *pSVar4;
  time_point end;
  SConfig *pSVar5;
  cl_mem in_RCX;
  cl_command_properties_khr *in_RDX;
  cl_command_queue in_RSI;
  cl_command_buffer_khr in_RDI;
  cl_mem in_R8;
  CLIntercept *in_R9;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  cl_uint in_stack_00000018;
  cl_sync_point_khr *in_stack_00000020;
  cl_sync_point_khr *in_stack_00000028;
  cl_mutable_command_khr *in_stack_00000030;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  string syncPointWaitList;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  CLIntercept *in_stack_fffffffffffffd90;
  cl_sync_point_khr *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  cl_uint num_sync_points_in_wait_list_00;
  CLIntercept *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb8;
  allocator *paVar6;
  cl_uint dim;
  CLIntercept *in_stack_fffffffffffffdd0;
  CLIntercept *this;
  SConfig *in_stack_fffffffffffffdf0;
  SConfig *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  cl_uint num_sync_points_in_wait_list_01;
  SConfig *in_stack_fffffffffffffe08;
  CLIntercept *in_stack_fffffffffffffe10;
  undefined1 includeId;
  CLIntercept *in_stack_fffffffffffffe20;
  allocator *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  time_point in_stack_fffffffffffffe38;
  time_point in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  int local_16c;
  undefined8 local_168;
  undefined8 local_160;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  undefined8 local_108;
  undefined8 local_100;
  allocator local_f1;
  string local_f0 [32];
  undefined8 local_d0;
  int local_c4;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  string local_98 [32];
  uint64_t local_78;
  cl_int errorCode;
  cl_int local_2c;
  
  dim = (cl_uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  num_sync_points_in_wait_list_01 = (cl_uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
  num_sync_points_in_wait_list_00 = (cl_uint)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  pCVar2 = GetIntercept();
  if ((pCVar2 == (CLIntercept *)0x0) ||
     (pCVar3 = CLIntercept::dispatchX
                         (in_stack_fffffffffffffd90,
                          (cl_command_buffer_khr)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)),
     pCVar3->clCommandCopyBufferKHR ==
     (_func_cl_int_cl_command_buffer_khr_cl_command_queue_cl_command_properties_khr_ptr_cl_mem_cl_mem_size_t_size_t_size_t_cl_uint_cl_sync_point_khr_ptr_cl_sync_point_khr_ptr_cl_mutable_command_khr_ptr
      *)0x0)) {
    local_16c = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_16c);
    local_2c = -0x472;
  }
  else {
    local_78 = CLIntercept::getEnqueueCounter
                         ((CLIntercept *)
                          CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    getFormattedSyncPointWaitList_abi_cxx11_
              (in_stack_fffffffffffffda8,num_sync_points_in_wait_list_00,in_stack_fffffffffffffd98);
    pSVar4 = CLIntercept::config(pCVar2);
    enqueueCounter_00 = local_78;
    this = pCVar2;
    if ((pSVar4->CallLogging & 1U) != 0) {
      in_stack_fffffffffffffd80 =
           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            *)std::__cxx11::string::c_str();
      CLIntercept::callLoggingEnter
                (pCVar2,"clCommandCopyBufferKHR",enqueueCounter_00,(cl_kernel)0x0,
                 "command_buffer = %p, command_queue = %p%s",in_RDI,in_RSI);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffd80);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_fffffffffffffd80);
    pSVar4 = CLIntercept::config(this);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(this), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      local_c0 = std::chrono::_V2::steady_clock::now();
      local_b0 = local_c0;
    }
    cVar1 = (*pCVar3->clCommandCopyBufferKHR)
                      (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,(size_t)in_R9,in_stack_00000008,
                       in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                       in_stack_00000030);
    errorCode = (cl_int)((ulong)pCVar3 >> 0x20);
    local_c4 = cVar1;
    end.__d.__r = (duration)CLIntercept::config(this);
    if (((((SConfig *)end.__d.__r)->HostPerformanceTiming & 1U) != 0) ||
       (in_stack_fffffffffffffe40.__d.__r = (duration)CLIntercept::config(this),
       ((((CLIntercept *)in_stack_fffffffffffffe40.__d.__r)->m_Mutex).super___mutex_base._M_mutex.
        __size[0x11] & 1U) != 0)) {
      local_d0 = std::chrono::_V2::steady_clock::now();
      local_b8 = local_d0;
      in_stack_fffffffffffffe38.__d.__r = (duration)CLIntercept::config(this);
      if (((((SConfig *)in_stack_fffffffffffffe38.__d.__r)->HostPerformanceTiming & 1U) != 0) &&
         (in_stack_fffffffffffffe37 =
               CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,local_78),
         (bool)in_stack_fffffffffffffe37)) {
        in_stack_fffffffffffffe28 = &local_f1;
        pCVar2 = this;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"",in_stack_fffffffffffffe28);
        local_100 = local_b0;
        local_108 = local_b8;
        start.__d.__r._4_4_ = cVar1;
        start.__d.__r._0_4_ = in_stack_fffffffffffffe50;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_fffffffffffffe40.__d.__r,
                   (char *)in_stack_fffffffffffffe38.__d.__r,
                   (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),start,end
                  );
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        in_stack_fffffffffffffe20 = this;
        this = pCVar2;
      }
    }
    pSVar4 = CLIntercept::config(this);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (in_stack_fffffffffffffe10 = (CLIntercept *)CLIntercept::config(this),
         ((in_stack_fffffffffffffe10->m_Mutex).super___mutex_base._M_mutex.__size[0x14] & 1U) != 0))
        || (in_stack_fffffffffffffe08 = CLIntercept::config(this),
           (in_stack_fffffffffffffe08->NoErrors & 1U) != 0)) && (local_c4 != 0)) {
      pSVar5 = CLIntercept::config(this);
      if ((pSVar5->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_R9,(char *)this,errorCode);
      }
      num_sync_points_in_wait_list_01 = (cl_uint)((ulong)pSVar5 >> 0x20);
      in_stack_fffffffffffffdf8 = CLIntercept::config(this);
      if ((in_stack_fffffffffffffdf8->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      in_stack_fffffffffffffdf0 = CLIntercept::config(this);
      if ((in_stack_fffffffffffffdf0->NoErrors & 1U) != 0) {
        local_c4 = 0;
      }
    }
    pCVar2 = this;
    if (((local_c4 == 0) && (in_RDI != (cl_command_buffer_khr)0x0)) &&
       (pSVar5 = CLIntercept::config(this), pCVar2 = this, (pSVar5->DumpCommandBuffers & 1U) != 0))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"",&local_129);
      CLIntercept::recordCommandBufferCommand
                (in_stack_fffffffffffffe20,(cl_command_buffer_khr)pSVar4,
                 (char *)in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08,
                 num_sync_points_in_wait_list_01,(cl_sync_point_khr *)in_stack_fffffffffffffdf8,
                 (cl_sync_point_khr *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30))
      ;
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      in_stack_fffffffffffffdd0 = this;
    }
    includeId = (undefined1)((ulong)pSVar4 >> 0x38);
    pSVar4 = CLIntercept::config(pCVar2);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_fffffffffffffe10,&in_stack_fffffffffffffe08->SuppressLogging,
                 num_sync_points_in_wait_list_01,(cl_event *)in_stack_fffffffffffffdf8,
                 (cl_sync_point_khr *)in_stack_fffffffffffffdf0);
    }
    pSVar5 = CLIntercept::config(pCVar2);
    if ((pSVar5->ChromeCallLogging & 1U) != 0) {
      paVar6 = &local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"",paVar6);
      dim = (cl_uint)((ulong)paVar6 >> 0x20);
      local_160 = local_b0;
      local_168 = local_b8;
      CLIntercept::chromeCallLoggingExit
                ((CLIntercept *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (char *)in_stack_fffffffffffffe28,(string *)in_stack_fffffffffffffe20,
                 (bool)includeId,(uint64_t)in_stack_fffffffffffffe10,in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe38);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
    }
    if ((in_stack_00000030 != (cl_mutable_command_khr *)0x0) &&
       (*in_stack_00000030 != (cl_mutable_command_khr)0x0)) {
      CLIntercept::addMutableCommandInfo
                (in_stack_fffffffffffffdd0,(cl_mutable_command_khr)pSVar4,
                 (cl_command_buffer_khr)pSVar5,dim);
    }
    local_2c = local_c4;
    std::__cxx11::string::~string(local_98);
  }
  return local_2c;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clCommandCopyBufferKHR(
    cl_command_buffer_khr command_buffer,
    cl_command_queue command_queue,
    const cl_command_properties_khr* properties,
    cl_mem src_buffer,
    cl_mem dst_buffer,
    size_t src_offset,
    size_t dst_offset,
    size_t size,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point,
    cl_mutable_command_khr* mutable_handle)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clCommandCopyBufferKHR )
        {
            GET_ENQUEUE_COUNTER();

            const std::string syncPointWaitList = getFormattedSyncPointWaitList(
                pIntercept,
                num_sync_points_in_wait_list,
                sync_point_wait_list);

            CALL_LOGGING_ENTER(
                "command_buffer = %p, command_queue = %p%s",
                command_buffer,
                command_queue,
                syncPointWaitList.c_str() );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clCommandCopyBufferKHR(
                command_buffer,
                command_queue,
                properties,
                src_buffer,
                dst_buffer,
                src_offset,
                dst_offset,
                size,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point,
                mutable_handle );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            RECORD_COMMAND_BUFFER_COMMAND(
                retVal,
                command_buffer,
                num_sync_points_in_wait_list,
                sync_point_wait_list,
                sync_point );
            CALL_LOGGING_EXIT_SYNC_POINT( retVal, sync_point );
            ADD_MUTABLE_COMMAND( mutable_handle, command_buffer );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}